

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O2

tuple<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
 __thiscall nonius::detail::option::long_separator(option *this,string *s)

{
  long *in_RDX;
  undefined8 extraout_RDX;
  pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pVar1;
  tuple<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&local_38,"--",s);
  pVar1 = mismatch<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,nonius::detail::option::long_separator(std::__cxx11::string_const&)const::_lambda(char,char)_1_>
                    (*in_RDX,in_RDX[1] + *in_RDX,local_38._M_dataplus._M_p,
                     local_38._M_dataplus._M_p + local_38._M_string_length);
  (this->long_form)._M_dataplus._M_p = pVar1.first._M_current._M_current;
  *(bool *)&(this->long_form)._M_string_length =
       pVar1.second._M_current._M_current == local_38._M_dataplus._M_p + local_38._M_string_length;
  std::__cxx11::string::~string((string *)&local_38);
  tVar2.
  super__Tuple_impl<0UL,_bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._8_8_ = extraout_RDX;
  tVar2.
  super__Tuple_impl<0UL,_bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Tuple_impl<1UL,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<1UL,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  ._M_head_impl._M_current =
       (_Head_base<1UL,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
        )(_Head_base<1UL,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
          )this;
  return (tuple<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )tVar2.
           super__Tuple_impl<0UL,_bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ;
}

Assistant:

std::tuple<bool, std::string::const_iterator> long_separator(std::string const& s) const {
                auto l = "--" + long_form;
                auto its = detail::mismatch(s.begin(), s.end(), l.begin(), l.end(), [](char a, char b) { return a == b; });
                return std::make_tuple(its.second == l.end(), its.first);
            }